

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int rngStreamTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  xmlTextReaderPtr reader;
  int in_R9D;
  ulong uVar8;
  int local_884;
  glob_t globbuf;
  char prefix [500];
  char err [500];
  char pattern [500];
  char result [500];
  
  pcVar5 = baseFilename(filename);
  sVar6 = strlen(pcVar5);
  if ((int)sVar6 - 500U < 0xfffffe11) {
    fprintf(_stderr,"len(base) == %d !\n",sVar6 & 0xffffffff);
    return -1;
  }
  uVar8 = (ulong)((int)sVar6 - 4);
  memcpy(prefix,pcVar5,uVar8);
  prefix[uVar8] = '\0';
  iVar3 = bcmp(prefix,"tutor10_1",10);
  if ((((iVar3 == 0) || (iVar3 = bcmp(prefix,"tutor10_2",10), iVar3 == 0)) ||
      (iVar3 = bcmp(prefix,"tutor3_2",9), iVar3 == 0)) ||
     ((iVar3 = bcmp(prefix,"307377",7), iVar3 == 0 ||
      (iVar3 = bcmp(prefix,"tutor8_2",9), iVar3 == 0)))) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  iVar3 = snprintf(pattern,499,"./test/relaxng/%s_?.xml",prefix);
  if (0x1f2 < iVar3) {
    pattern[499] = '\0';
  }
  globbuf.gl_offs = 0;
  glob64(pattern,8,(__errfunc *)0x0,(glob64_t *)&globbuf);
  local_884 = 0;
  uVar8 = 0;
  do {
    if (globbuf.gl_pathc <= uVar8) {
      globfree64((glob64_t *)&globbuf);
      return local_884;
    }
    testErrorsSize = 0;
    testErrors[0] = '\0';
    pcVar5 = globbuf.gl_pathv[uVar8];
    pcVar7 = baseFilename(pcVar5);
    sVar6 = strlen(pcVar7);
    iVar3 = (int)sVar6;
    if ((iVar3 < 7) || (pcVar7[iVar3 - 6] != '_')) {
      pcVar7 = "don\'t know how to process %s\n";
      iVar3 = local_884;
LAB_001091e7:
      fprintf(_stderr,pcVar7,pcVar5);
      local_884 = iVar3;
    }
    else {
      cVar1 = pcVar7[iVar3 - 5];
      iVar3 = snprintf(result,499,"result/relaxng/%s_%c",prefix,(ulong)(uint)(int)cVar1);
      if (0x1f2 < iVar3) {
        result[499] = '\0';
      }
      iVar3 = snprintf(err,499,"result/relaxng/%s_%c.err",prefix,(ulong)(uint)(int)cVar1);
      if (0x1f2 < iVar3) {
        err[499] = '\0';
      }
      reader = (xmlTextReaderPtr)xmlReaderForFile(pcVar5,0,options);
      if (reader == (xmlTextReaderPtr)0x0) {
        fprintf(_stderr,"Failed to build reader for %s\n",pcVar5);
      }
      if (bVar2) {
        pcVar7 = (char *)0x0;
      }
      else {
        pcVar7 = err;
      }
      iVar4 = streamProcessTest(pcVar5,result,pcVar7,reader,filename,in_R9D);
      xmlFreeTextReader(reader);
      pcVar7 = "instance %s failed\n";
      iVar3 = -1;
      if (iVar4 != 0) goto LAB_001091e7;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static int
rngStreamTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    int res = 0, len, ret;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;
    xmlTextReaderPtr reader;
    int disable_err = 0;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
	fprintf(stderr, "len(base) == %d !\n", len);
	return(-1);
    }
    len -= 4; /* remove trailing .rng */
    memcpy(prefix, base, len);
    prefix[len] = 0;

    /*
     * strictly unifying the error messages is nearly impossible this
     * hack is also done in the Makefile
     */
    if ((!strcmp(prefix, "tutor10_1")) || (!strcmp(prefix, "tutor10_2")) ||
        (!strcmp(prefix, "tutor3_2")) || (!strcmp(prefix, "307377")) ||
        (!strcmp(prefix, "tutor8_2")))
	disable_err = 1;

    if (snprintf(pattern, 499, "./test/relaxng/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = 0;
	testErrors[0] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/relaxng/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/relaxng/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	reader = xmlReaderForFile(instance, NULL, options);
	if (reader == NULL) {
	    fprintf(stderr, "Failed to build reader for %s\n", instance);
	}
	if (disable_err == 1)
	    ret = streamProcessTest(instance, result, NULL, reader, filename,
	                            options);
	else
	    ret = streamProcessTest(instance, result, err, reader, filename,
	                            options);
	xmlFreeTextReader(reader);
	if (ret != 0) {
	    fprintf(stderr, "instance %s failed\n", instance);
	    res = ret;
	}
    }
    globfree(&globbuf);

    return(res);
}